

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcommon.cpp
# Opt level: O3

string * __thiscall message::to_string_abi_cxx11_(string *__return_storage_ptr__,message *this)

{
  ostream *poVar1;
  stringstream buffer;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Message with id ",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," has contents ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->body_)._M_dataplus._M_p,(this->body_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string message::to_string() {
    std::stringstream buffer;
    buffer << "Message with id " << id() << " has contents " << "'" << body() << "'";
    return buffer.str();
}